

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

void unpack_scanline(uchar *out,uchar *scanline,uint32_t width,uint bit_depth,int fmt)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  bVar4 = ~(byte)(-1 << ((byte)bit_depth & 0x1f));
  uVar5 = 8 - bit_depth;
  if (fmt == 0x20) {
    if (bit_depth == 0x10) {
      if (width != 0) {
        uVar3 = 0;
        do {
          uVar2 = (ulong)(uint)((int)uVar3 * 4);
          *(undefined2 *)(out + uVar2) = *(undefined2 *)(scanline + (uint)((int)uVar3 * 2));
          (out + uVar2 + 2)[0] = 0xff;
          (out + uVar2 + 2)[1] = 0xff;
          uVar3 = uVar3 + 1;
        } while (uVar3 != width);
      }
    }
    else if (width != 0) {
      uVar3 = 0;
      uVar6 = uVar5;
      do {
        uVar7 = uVar6 - bit_depth;
        uVar8 = uVar7;
        if (7 < uVar7) {
          uVar8 = uVar5;
        }
        bVar1 = *scanline;
        scanline = scanline + (7 < uVar7);
        *(ushort *)(out + (uVar3 & 0xffffffff)) = (ushort)(bVar1 >> ((byte)uVar6 & 0x1f) & bVar4);
        (out + (uVar3 & 0xffffffff) + 2)[0] = 0xff;
        (out + (uVar3 & 0xffffffff) + 2)[1] = 0xff;
        uVar3 = uVar3 + 4;
        uVar6 = uVar8;
      } while ((ulong)width << 2 != uVar3);
    }
  }
  else if (fmt == 0x10) {
    if (width != 0) {
      uVar3 = 0;
      uVar6 = uVar5;
      do {
        bVar1 = *scanline;
        uVar7 = uVar6 - bit_depth;
        uVar8 = uVar7;
        if (7 < uVar7) {
          uVar8 = uVar5;
        }
        scanline = scanline + (7 < uVar7);
        out[uVar3 & 0xffffffff] = bVar1 >> ((byte)uVar6 & 0x1f) & bVar4;
        out[(int)uVar3 + 1] = 0xff;
        uVar3 = uVar3 + 2;
        uVar6 = uVar8;
      } while ((ulong)width * 2 != uVar3);
    }
  }
  else if (width != 0) {
    uVar3 = 0;
    uVar6 = uVar5;
    do {
      uVar7 = uVar6 - bit_depth;
      uVar8 = uVar7;
      if (7 < uVar7) {
        uVar8 = uVar5;
      }
      bVar1 = *scanline;
      scanline = scanline + (7 < uVar7);
      out[uVar3] = bVar1 >> ((byte)uVar6 & 0x1f) & bVar4;
      uVar3 = uVar3 + 1;
      uVar6 = uVar8;
    } while (width != uVar3);
  }
  return;
}

Assistant:

static void unpack_scanline(unsigned char *out, const unsigned char *scanline, uint32_t width, unsigned bit_depth, int fmt)
{
    struct spng__iter iter = spng__iter_init(bit_depth, scanline);
    uint32_t i;
    uint16_t sample, alpha = 65535;


    if(fmt == SPNG_FMT_GA8) goto ga8;
    else if(fmt == SPNG_FMT_GA16) goto ga16;

    /* 1/2/4-bit -> 8-bit */
    for(i=0; i < width; i++) out[i] = get_sample(&iter);

    return;

ga8:
    /* 1/2/4/8-bit -> GA8 */
    for(i=0; i < width; i++)
    {
        out[i*2] = get_sample(&iter);
        out[i*2 + 1] = 255;
    }

    return;

ga16:

    /* 16 -> GA16 */
    if(bit_depth == 16)
    {
        for(i=0; i < width; i++)
        {
            memcpy(out + i * 4, scanline + i * 2, 2);
            memcpy(out + i * 4 + 2, &alpha, 2);
        }
        return;
    }

     /* 1/2/4/8-bit -> GA16 */
    for(i=0; i < width; i++)
    {
        sample = get_sample(&iter);
        memcpy(out + i * 4, &sample, 2);
        memcpy(out + i * 4 + 2, &alpha, 2);
    }
}